

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void deferred_on_close(void *uuid_,void *pr_)

{
  fio_defer_task_s task;
  fio_protocol_s *pr;
  
  if (*(long *)((long)pr_ + 0x28) != 0) {
    task.arg1 = uuid_;
    task.func = deferred_on_close;
    task.arg2 = pr_;
    fio_defer_push_task_fn(task,&task_queue_normal);
    return;
  }
  (**(code **)((long)pr_ + 0x18))();
  return;
}

Assistant:

static void deferred_on_close(void *uuid_, void *pr_) {
  fio_protocol_s *pr = pr_;
  if (pr->rsv)
    goto postpone;
  pr->on_close((intptr_t)uuid_, pr);
  return;
postpone:
  fio_defer_push_task(deferred_on_close, uuid_, pr_);
}